

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::GPUShaderFP64Test6::iterate(GPUShaderFP64Test6 *this)

{
  bool bVar1;
  NotSupportedError *this_00;
  char *description;
  long lVar2;
  _test_case test_cases [42];
  undefined1 local_2258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2248;
  undefined1 local_2238 [16];
  undefined1 *local_2228 [2];
  undefined1 local_2218 [16];
  undefined1 *local_2208 [2];
  undefined1 local_21f8 [16];
  undefined1 *local_21e8 [2];
  undefined1 local_21d8 [16];
  undefined1 *local_21c8 [2];
  undefined1 local_21b8 [16];
  undefined1 *local_21a8 [2];
  undefined1 local_2198 [16];
  undefined8 local_2188;
  undefined4 local_2180;
  undefined1 local_217c;
  undefined1 *local_2178 [2];
  undefined1 local_2168 [16];
  undefined1 *local_2158 [2];
  undefined1 local_2148 [16];
  undefined1 *local_2138 [2];
  undefined1 local_2128 [16];
  undefined1 *local_2118 [2];
  undefined1 local_2108 [16];
  undefined1 *local_20f8 [2];
  undefined1 local_20e8 [16];
  undefined1 *local_20d8 [2];
  undefined1 local_20c8 [16];
  undefined8 local_20b8;
  undefined4 local_20b0;
  undefined1 local_20ac;
  undefined1 *local_20a8 [2];
  undefined1 local_2098 [16];
  undefined1 *local_2088 [2];
  undefined1 local_2078 [16];
  undefined1 *local_2068 [2];
  undefined1 local_2058 [16];
  undefined1 *local_2048 [2];
  undefined1 local_2038 [16];
  undefined1 *local_2028 [2];
  undefined1 local_2018 [16];
  undefined1 *local_2008 [2];
  undefined1 local_1ff8 [16];
  undefined8 local_1fe8;
  undefined4 local_1fe0;
  undefined1 local_1fdc;
  undefined1 *local_1fd8 [2];
  undefined1 local_1fc8 [16];
  undefined1 *local_1fb8 [2];
  undefined1 local_1fa8 [16];
  undefined1 *local_1f98 [2];
  undefined1 local_1f88 [16];
  undefined1 *local_1f78 [2];
  undefined1 local_1f68 [16];
  undefined1 *local_1f58 [2];
  undefined1 local_1f48 [16];
  undefined1 *local_1f38 [2];
  undefined1 local_1f28 [16];
  undefined8 local_1f18;
  undefined4 local_1f10;
  undefined1 local_1f0c;
  undefined1 *local_1f08 [2];
  undefined1 local_1ef8 [16];
  undefined1 *local_1ee8 [2];
  undefined1 local_1ed8 [16];
  undefined1 *local_1ec8 [2];
  undefined1 local_1eb8 [16];
  undefined1 *local_1ea8 [2];
  undefined1 local_1e98 [16];
  undefined1 *local_1e88 [2];
  undefined1 local_1e78 [16];
  undefined1 *local_1e68 [2];
  undefined1 local_1e58 [16];
  undefined8 local_1e48;
  undefined4 local_1e40;
  undefined1 local_1e3c;
  undefined1 *local_1e38 [2];
  undefined1 local_1e28 [16];
  undefined1 *local_1e18 [2];
  undefined1 local_1e08 [16];
  undefined1 *local_1df8 [2];
  undefined1 local_1de8 [16];
  undefined1 *local_1dd8 [2];
  undefined1 local_1dc8 [16];
  undefined1 *local_1db8 [2];
  undefined1 local_1da8 [16];
  undefined1 *local_1d98 [2];
  undefined1 local_1d88 [16];
  undefined8 local_1d78;
  undefined4 local_1d70;
  undefined1 local_1d6c;
  undefined1 *local_1d68 [2];
  undefined1 local_1d58 [16];
  undefined1 *local_1d48 [2];
  undefined1 local_1d38 [16];
  undefined1 *local_1d28 [2];
  undefined1 local_1d18 [16];
  undefined1 *local_1d08 [2];
  undefined1 local_1cf8 [16];
  undefined1 *local_1ce8 [2];
  undefined1 local_1cd8 [16];
  undefined1 *local_1cc8 [2];
  undefined1 local_1cb8 [16];
  undefined8 local_1ca8;
  undefined4 local_1ca0;
  undefined1 local_1c9c;
  undefined1 *local_1c98 [2];
  undefined1 local_1c88 [16];
  undefined1 *local_1c78 [2];
  undefined1 local_1c68 [16];
  undefined1 *local_1c58 [2];
  undefined1 local_1c48 [16];
  undefined1 *local_1c38 [2];
  undefined1 local_1c28 [16];
  undefined1 *local_1c18 [2];
  undefined1 local_1c08 [16];
  undefined1 *local_1bf8 [2];
  undefined1 local_1be8 [16];
  undefined8 local_1bd8;
  undefined4 local_1bd0;
  undefined1 local_1bcc;
  undefined1 *local_1bc8 [2];
  undefined1 local_1bb8 [16];
  undefined1 *local_1ba8 [2];
  undefined1 local_1b98 [16];
  undefined1 *local_1b88 [2];
  undefined1 local_1b78 [16];
  undefined1 *local_1b68 [2];
  undefined1 local_1b58 [16];
  undefined1 *local_1b48 [2];
  undefined1 local_1b38 [16];
  undefined1 *local_1b28 [2];
  undefined1 local_1b18 [16];
  undefined8 local_1b08;
  undefined4 local_1b00;
  undefined1 local_1afc;
  undefined1 *local_1af8 [2];
  undefined1 local_1ae8 [16];
  undefined1 *local_1ad8 [2];
  undefined1 local_1ac8 [16];
  undefined1 *local_1ab8 [2];
  undefined1 local_1aa8 [16];
  undefined1 *local_1a98 [2];
  undefined1 local_1a88 [16];
  undefined1 *local_1a78 [2];
  undefined1 local_1a68 [16];
  undefined1 *local_1a58 [2];
  undefined1 local_1a48 [16];
  undefined8 local_1a38;
  undefined4 local_1a30;
  undefined1 local_1a2c;
  undefined1 *local_1a28 [2];
  undefined1 local_1a18 [16];
  undefined1 *local_1a08 [2];
  undefined1 local_19f8 [16];
  undefined1 *local_19e8 [2];
  undefined1 local_19d8 [16];
  undefined1 *local_19c8 [2];
  undefined1 local_19b8 [16];
  undefined1 *local_19a8 [2];
  undefined1 local_1998 [16];
  undefined1 *local_1988 [2];
  undefined1 local_1978 [16];
  undefined8 local_1968;
  undefined4 local_1960;
  undefined1 local_195c;
  undefined1 *local_1958 [2];
  undefined1 local_1948 [16];
  undefined1 *local_1938 [2];
  undefined1 local_1928 [16];
  undefined1 *local_1918 [2];
  undefined1 local_1908 [16];
  undefined1 *local_18f8 [2];
  undefined1 local_18e8 [16];
  undefined1 *local_18d8 [2];
  undefined1 local_18c8 [16];
  undefined1 *local_18b8 [2];
  undefined1 local_18a8 [16];
  undefined8 local_1898;
  undefined4 local_1890;
  undefined1 local_188c;
  undefined1 *local_1888 [2];
  undefined1 local_1878 [16];
  undefined1 *local_1868 [2];
  undefined1 local_1858 [16];
  undefined1 *local_1848 [2];
  undefined1 local_1838 [16];
  undefined1 *local_1828 [2];
  undefined1 local_1818 [16];
  undefined1 *local_1808 [2];
  undefined1 local_17f8 [16];
  undefined1 *local_17e8 [2];
  undefined1 local_17d8 [16];
  undefined8 local_17c8;
  undefined4 local_17c0;
  undefined1 local_17bc;
  undefined1 *local_17b8 [2];
  undefined1 local_17a8 [16];
  undefined1 *local_1798 [2];
  undefined1 local_1788 [16];
  undefined1 *local_1778 [2];
  undefined1 local_1768 [16];
  undefined1 *local_1758 [2];
  undefined1 local_1748 [16];
  undefined1 *local_1738 [2];
  undefined1 local_1728 [16];
  undefined1 *local_1718 [2];
  undefined1 local_1708 [16];
  undefined8 local_16f8;
  undefined4 local_16f0;
  undefined1 local_16ec;
  undefined1 *local_16e8 [2];
  undefined1 local_16d8 [16];
  undefined1 *local_16c8 [2];
  undefined1 local_16b8 [16];
  undefined1 *local_16a8 [2];
  undefined1 local_1698 [16];
  undefined1 *local_1688 [2];
  undefined1 local_1678 [16];
  undefined1 *local_1668 [2];
  undefined1 local_1658 [16];
  undefined1 *local_1648 [2];
  undefined1 local_1638 [16];
  undefined8 local_1628;
  undefined4 local_1620;
  undefined1 local_161c;
  undefined1 *local_1618 [2];
  undefined1 local_1608 [16];
  undefined1 *local_15f8 [2];
  undefined1 local_15e8 [16];
  undefined1 *local_15d8 [2];
  undefined1 local_15c8 [16];
  undefined1 *local_15b8 [2];
  undefined1 local_15a8 [16];
  undefined1 *local_1598 [2];
  undefined1 local_1588 [16];
  undefined1 *local_1578 [2];
  undefined1 local_1568 [16];
  undefined8 local_1558;
  undefined4 local_1550;
  undefined1 local_154c;
  undefined1 *local_1548 [2];
  undefined1 local_1538 [16];
  undefined1 *local_1528 [2];
  undefined1 local_1518 [16];
  undefined1 *local_1508 [2];
  undefined1 local_14f8 [16];
  undefined1 *local_14e8 [2];
  undefined1 local_14d8 [16];
  undefined1 *local_14c8 [2];
  undefined1 local_14b8 [16];
  undefined1 *local_14a8 [2];
  undefined1 local_1498 [16];
  undefined8 local_1488;
  undefined4 local_1480;
  undefined1 local_147c;
  undefined1 *local_1478 [2];
  undefined1 local_1468 [16];
  undefined1 *local_1458 [2];
  undefined1 local_1448 [16];
  undefined1 *local_1438 [2];
  undefined1 local_1428 [16];
  undefined1 *local_1418 [2];
  undefined1 local_1408 [16];
  undefined1 *local_13f8 [2];
  undefined1 local_13e8 [16];
  undefined1 *local_13d8 [2];
  undefined1 local_13c8 [16];
  undefined8 local_13b8;
  undefined4 local_13b0;
  undefined1 local_13ac;
  undefined1 *local_13a8 [2];
  undefined1 local_1398 [16];
  undefined1 *local_1388 [2];
  undefined1 local_1378 [16];
  undefined1 *local_1368 [2];
  undefined1 local_1358 [16];
  undefined1 *local_1348 [2];
  undefined1 local_1338 [16];
  undefined1 *local_1328 [2];
  undefined1 local_1318 [16];
  undefined1 *local_1308 [2];
  undefined1 local_12f8 [16];
  undefined8 local_12e8;
  undefined4 local_12e0;
  undefined1 local_12dc;
  undefined1 *local_12d8 [2];
  undefined1 local_12c8 [16];
  undefined1 *local_12b8 [2];
  undefined1 local_12a8 [16];
  undefined1 *local_1298 [2];
  undefined1 local_1288 [16];
  undefined1 *local_1278 [2];
  undefined1 local_1268 [16];
  undefined1 *local_1258 [2];
  undefined1 local_1248 [16];
  undefined1 *local_1238 [2];
  undefined1 local_1228 [16];
  undefined8 local_1218;
  undefined4 local_1210;
  undefined1 local_120c;
  undefined1 *local_1208 [2];
  undefined1 local_11f8 [16];
  undefined1 *local_11e8 [2];
  undefined1 local_11d8 [16];
  undefined1 *local_11c8 [2];
  undefined1 local_11b8 [16];
  undefined1 *local_11a8 [2];
  undefined1 local_1198 [16];
  undefined1 *local_1188 [2];
  undefined1 local_1178 [16];
  undefined1 *local_1168 [2];
  undefined1 local_1158 [16];
  undefined8 local_1148;
  undefined4 local_1140;
  undefined1 local_113c;
  undefined1 *local_1138 [2];
  undefined1 local_1128 [16];
  undefined1 *local_1118 [2];
  undefined1 local_1108 [16];
  undefined1 *local_10f8 [2];
  undefined1 local_10e8 [16];
  undefined1 *local_10d8 [2];
  undefined1 local_10c8 [16];
  undefined1 *local_10b8 [2];
  undefined1 local_10a8 [16];
  undefined1 *local_1098 [2];
  undefined1 local_1088 [16];
  undefined8 local_1078;
  undefined4 local_1070;
  undefined1 local_106c;
  undefined1 *local_1068 [2];
  undefined1 local_1058 [16];
  undefined1 *local_1048 [2];
  undefined1 local_1038 [16];
  undefined1 *local_1028 [2];
  undefined1 local_1018 [16];
  undefined1 *local_1008 [2];
  undefined1 local_ff8 [16];
  undefined1 *local_fe8 [2];
  undefined1 local_fd8 [16];
  undefined1 *local_fc8 [2];
  undefined1 local_fb8 [16];
  undefined8 local_fa8;
  undefined4 local_fa0;
  undefined1 local_f9c;
  undefined1 *local_f98 [2];
  undefined1 local_f88 [16];
  undefined1 *local_f78 [2];
  undefined1 local_f68 [16];
  undefined1 *local_f58 [2];
  undefined1 local_f48 [16];
  undefined1 *local_f38 [2];
  undefined1 local_f28 [16];
  undefined1 *local_f18 [2];
  undefined1 local_f08 [16];
  undefined1 *local_ef8 [2];
  undefined1 local_ee8 [16];
  undefined8 local_ed8;
  undefined4 local_ed0;
  undefined1 local_ecc;
  undefined1 *local_ec8 [2];
  undefined1 local_eb8 [16];
  undefined1 *local_ea8 [2];
  undefined1 local_e98 [16];
  undefined1 *local_e88 [2];
  undefined1 local_e78 [16];
  undefined1 *local_e68 [2];
  undefined1 local_e58 [16];
  undefined1 *local_e48 [2];
  undefined1 local_e38 [16];
  undefined1 *local_e28 [2];
  undefined1 local_e18 [16];
  undefined8 local_e08;
  undefined4 local_e00;
  undefined1 local_dfc;
  undefined1 *local_df8 [2];
  undefined1 local_de8 [16];
  undefined1 *local_dd8 [2];
  undefined1 local_dc8 [16];
  undefined1 *local_db8 [2];
  undefined1 local_da8 [16];
  undefined1 *local_d98 [2];
  undefined1 local_d88 [16];
  undefined1 *local_d78 [2];
  undefined1 local_d68 [16];
  undefined1 *local_d58 [2];
  undefined1 local_d48 [16];
  undefined8 local_d38;
  undefined4 local_d30;
  undefined1 local_d2c;
  undefined1 *local_d28 [2];
  undefined1 local_d18 [16];
  undefined1 *local_d08 [2];
  undefined1 local_cf8 [16];
  undefined1 *local_ce8 [2];
  undefined1 local_cd8 [16];
  undefined1 *local_cc8 [2];
  undefined1 local_cb8 [16];
  undefined1 *local_ca8 [2];
  undefined1 local_c98 [16];
  undefined1 *local_c88 [2];
  undefined1 local_c78 [16];
  undefined8 local_c68;
  undefined4 local_c60;
  undefined1 local_c5c;
  undefined1 *local_c58 [2];
  undefined1 local_c48 [16];
  undefined1 *local_c38 [2];
  undefined1 local_c28 [16];
  undefined1 *local_c18 [2];
  undefined1 local_c08 [16];
  undefined1 *local_bf8 [2];
  undefined1 local_be8 [16];
  undefined1 *local_bd8 [2];
  undefined1 local_bc8 [16];
  undefined1 *local_bb8 [2];
  undefined1 local_ba8 [16];
  undefined8 local_b98;
  undefined4 local_b90;
  undefined1 local_b8c;
  undefined1 *local_b88 [2];
  undefined1 local_b78 [16];
  undefined1 *local_b68 [2];
  undefined1 local_b58 [16];
  undefined1 *local_b48 [2];
  undefined1 local_b38 [16];
  undefined1 *local_b28 [2];
  undefined1 local_b18 [16];
  undefined1 *local_b08 [2];
  undefined1 local_af8 [16];
  undefined1 *local_ae8 [2];
  undefined1 local_ad8 [16];
  undefined8 local_ac8;
  undefined4 local_ac0;
  undefined1 local_abc;
  undefined1 *local_ab8 [2];
  undefined1 local_aa8 [16];
  undefined1 *local_a98 [2];
  undefined1 local_a88 [16];
  undefined1 *local_a78 [2];
  undefined1 local_a68 [16];
  undefined1 *local_a58 [2];
  undefined1 local_a48 [16];
  undefined1 *local_a38 [2];
  undefined1 local_a28 [16];
  undefined1 *local_a18 [2];
  undefined1 local_a08 [16];
  undefined8 local_9f8;
  undefined4 local_9f0;
  undefined1 local_9ec;
  undefined1 *local_9e8 [2];
  undefined1 local_9d8 [16];
  undefined1 *local_9c8 [2];
  undefined1 local_9b8 [16];
  undefined1 *local_9a8 [2];
  undefined1 local_998 [16];
  undefined1 *local_988 [2];
  undefined1 local_978 [16];
  undefined1 *local_968 [2];
  undefined1 local_958 [16];
  undefined1 *local_948 [2];
  undefined1 local_938 [16];
  undefined8 local_928;
  undefined4 local_920;
  undefined1 local_91c;
  undefined1 *local_918 [2];
  undefined1 local_908 [16];
  undefined1 *local_8f8 [2];
  undefined1 local_8e8 [16];
  undefined1 *local_8d8 [2];
  undefined1 local_8c8 [16];
  undefined1 *local_8b8 [2];
  undefined1 local_8a8 [16];
  undefined1 *local_898 [2];
  undefined1 local_888 [16];
  undefined1 *local_878 [2];
  undefined1 local_868 [16];
  undefined8 local_858;
  undefined4 local_850;
  undefined1 local_84c;
  undefined1 *local_848 [2];
  undefined1 local_838 [16];
  undefined1 *local_828 [2];
  undefined1 local_818 [16];
  undefined1 *local_808 [2];
  undefined1 local_7f8 [16];
  undefined1 *local_7e8 [2];
  undefined1 local_7d8 [16];
  undefined1 *local_7c8 [2];
  undefined1 local_7b8 [16];
  undefined1 *local_7a8 [2];
  undefined1 local_798 [16];
  undefined8 local_788;
  undefined4 local_780;
  undefined1 local_77c;
  undefined1 *local_778 [2];
  undefined1 local_768 [16];
  undefined1 *local_758 [2];
  undefined1 local_748 [16];
  undefined1 *local_738 [2];
  undefined1 local_728 [16];
  undefined1 *local_718 [2];
  undefined1 local_708 [16];
  undefined1 *local_6f8 [2];
  undefined1 local_6e8 [16];
  undefined1 *local_6d8 [2];
  undefined1 local_6c8 [16];
  undefined8 local_6b8;
  undefined4 local_6b0;
  undefined1 local_6ac;
  undefined1 *local_6a8 [2];
  undefined1 local_698 [16];
  undefined1 *local_688 [2];
  undefined1 local_678 [16];
  undefined1 *local_668 [2];
  undefined1 local_658 [16];
  undefined1 *local_648 [2];
  undefined1 local_638 [16];
  undefined1 *local_628 [2];
  undefined1 local_618 [16];
  undefined1 *local_608 [2];
  undefined1 local_5f8 [16];
  undefined8 local_5e8;
  undefined4 local_5e0;
  undefined1 local_5dc;
  undefined1 *local_5d8 [2];
  undefined1 local_5c8 [16];
  undefined1 *local_5b8 [2];
  undefined1 local_5a8 [16];
  undefined1 *local_598 [2];
  undefined1 local_588 [16];
  undefined1 *local_578 [2];
  undefined1 local_568 [16];
  undefined1 *local_558 [2];
  undefined1 local_548 [16];
  undefined1 *local_538 [2];
  undefined1 local_528 [16];
  undefined8 local_518;
  undefined4 local_510;
  undefined1 local_50c;
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  undefined1 *local_4a8 [2];
  undefined1 local_498 [16];
  undefined1 *local_488 [2];
  undefined1 local_478 [16];
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  undefined8 local_448;
  undefined4 local_440;
  undefined1 local_43c;
  undefined1 *local_438 [2];
  undefined1 local_428 [16];
  undefined1 *local_418 [2];
  undefined1 local_408 [16];
  undefined1 *local_3f8 [2];
  undefined1 local_3e8 [16];
  undefined1 *local_3d8 [2];
  undefined1 local_3c8 [16];
  undefined1 *local_3b8 [2];
  undefined1 local_3a8 [16];
  undefined1 *local_398 [2];
  undefined1 local_388 [16];
  undefined8 local_378;
  undefined4 local_370;
  undefined1 local_36c;
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  undefined4 local_2a0;
  undefined1 local_29c;
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined4 local_1d0;
  undefined1 local_1cc;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined4 local_100;
  undefined1 local_fc;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_gpu_shader_fp64");
  if (bVar1) {
    initTest(this);
    local_2258._0_8_ = (pointer)0x1200000002;
    local_2258._8_4_ = 4;
    local_2258[0xc] = 0;
    local_2248._M_allocated_capacity = (size_type)local_2238;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_2258 + 0x10),0x1b32ab9);
    local_2228[0] = local_2218;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2228,0x1b32ab9);
    local_2208[0] = local_21f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2208,0x1b32ab9);
    local_21e8[0] = local_21d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_21e8,0x1b32ab9);
    local_21c8[0] = local_21b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_21c8,0x1b32ab9);
    local_21a8[0] = local_2198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_21a8,0x1b32ab9);
    local_2188 = 0x1200000002;
    local_2180 = 4;
    local_217c = 1;
    local_2178[0] = local_2168;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2178,0x1b32ab9);
    local_2158[0] = local_2148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2158,0x1b32ab9);
    local_2138[0] = local_2128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2138,0x1b32ab9);
    local_2118[0] = local_2108;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2118,0x1b32ab9);
    local_20f8[0] = local_20e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_20f8,0x1b32ab9);
    local_20d8[0] = local_20c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_20d8,0x1b32ab9);
    local_20b8 = 0x1300000002;
    local_20b0 = 0xe;
    local_20ac = 0;
    local_20a8[0] = local_2098;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_20a8,0x1b32ab9);
    local_2088[0] = local_2078;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2088,0x1b32ab9);
    local_2068[0] = local_2058;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2068,0x1b32ab9);
    local_2048[0] = local_2038;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2048,0x1b32ab9);
    local_2028[0] = local_2018;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2028,0x1b32ab9);
    local_2008[0] = local_1ff8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2008,0x1b32ab9);
    local_1fe8 = 0x1300000002;
    local_1fe0 = 0xe;
    local_1fdc = 1;
    local_1fd8[0] = local_1fc8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1fd8,0x1b32ab9);
    local_1fb8[0] = local_1fa8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1fb8,0x1b32ab9);
    local_1f98[0] = local_1f88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f98,0x1b32ab9);
    local_1f78[0] = local_1f68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f78,0x1b32ab9);
    local_1f58[0] = local_1f48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f58,0x1b32ab9);
    local_1f38[0] = local_1f28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f38,0x1b32ab9);
    local_1f18 = 0x1400000002;
    local_1f10 = 0xf;
    local_1f0c = 0;
    local_1f08[0] = local_1ef8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f08,0x1b32ab9);
    local_1ee8[0] = local_1ed8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1ee8,0x1b32ab9);
    local_1ec8[0] = local_1eb8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1ec8,0x1b32ab9);
    local_1ea8[0] = local_1e98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1ea8,0x1b32ab9);
    local_1e88[0] = local_1e78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e88,0x1b32ab9);
    local_1e68[0] = local_1e58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e68,0x1b32ab9);
    local_1e48 = 0x1400000002;
    local_1e40 = 0xf;
    local_1e3c = 1;
    local_1e38[0] = local_1e28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e38,0x1b32ab9);
    local_1e18[0] = local_1e08;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e18,0x1b32ab9);
    local_1df8[0] = local_1de8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1df8,0x1b32ab9);
    local_1dd8[0] = local_1dc8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1dd8,0x1b32ab9);
    local_1db8[0] = local_1da8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1db8,0x1b32ab9);
    local_1d98[0] = local_1d88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d98,0x1b32ab9);
    local_1d78 = 0x1500000002;
    local_1d70 = 0x10;
    local_1d6c = 0;
    local_1d68[0] = local_1d58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d68,0x1b32ab9);
    local_1d48[0] = local_1d38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d48,0x1b32ab9);
    local_1d28[0] = local_1d18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d28,0x1b32ab9);
    local_1d08[0] = local_1cf8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d08,0x1b32ab9);
    local_1ce8[0] = local_1cd8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1ce8,0x1b32ab9);
    local_1cc8[0] = local_1cb8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1cc8,0x1b32ab9);
    local_1ca8 = 0x1500000002;
    local_1ca0 = 0x10;
    local_1c9c = 1;
    local_1c98[0] = local_1c88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c98,0x1b32ab9);
    local_1c78[0] = local_1c68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c78,0x1b32ab9);
    local_1c58[0] = local_1c48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c58,0x1b32ab9);
    local_1c38[0] = local_1c28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c38,0x1b32ab9);
    local_1c18[0] = local_1c08;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c18,0x1b32ab9);
    local_1bf8[0] = local_1be8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1bf8,0x1b32ab9);
    local_1bd8 = 0x1f00000002;
    local_1bd0 = 4;
    local_1bcc = 0;
    local_1bc8[0] = local_1bb8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1bc8,0x1b32ab9);
    local_1ba8[0] = local_1b98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1ba8,0x1b32ab9);
    local_1b88[0] = local_1b78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b88,0x1b32ab9);
    local_1b68[0] = local_1b58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b68,0x1b32ab9);
    local_1b48[0] = local_1b38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b48,0x1b32ab9);
    local_1b28[0] = local_1b18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b28,0x1b32ab9);
    local_1b08 = 0x1f00000002;
    local_1b00 = 4;
    local_1afc = 1;
    local_1af8[0] = local_1ae8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1af8,0x1b32ab9);
    local_1ad8[0] = local_1ac8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1ad8,0x1b32ab9);
    local_1ab8[0] = local_1aa8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1ab8,0x1b32ab9);
    local_1a98[0] = local_1a88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a98,0x1b32ab9);
    local_1a78[0] = local_1a68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a78,0x1b32ab9);
    local_1a58[0] = local_1a48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a58,0x1b32ab9);
    local_1a38 = 0x2000000002;
    local_1a30 = 0xe;
    local_1a2c = 0;
    local_1a28[0] = local_1a18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a28,0x1b32ab9);
    local_1a08[0] = local_19f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a08,0x1b32ab9);
    local_19e8[0] = local_19d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_19e8,0x1b32ab9);
    local_19c8[0] = local_19b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_19c8,0x1b32ab9);
    local_19a8[0] = local_1998;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_19a8,0x1b32ab9);
    local_1988[0] = local_1978;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1988,0x1b32ab9);
    local_1968 = 0x2000000002;
    local_1960 = 0xe;
    local_195c = 1;
    local_1958[0] = local_1948;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1958,0x1b32ab9);
    local_1938[0] = local_1928;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1938,0x1b32ab9);
    local_1918[0] = local_1908;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1918,0x1b32ab9);
    local_18f8[0] = local_18e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_18f8,0x1b32ab9);
    local_18d8[0] = local_18c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_18d8,0x1b32ab9);
    local_18b8[0] = local_18a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_18b8,0x1b32ab9);
    local_1898 = 0x2100000002;
    local_1890 = 0xf;
    local_188c = 0;
    local_1888[0] = local_1878;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1888,0x1b32ab9);
    local_1868[0] = local_1858;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1868,0x1b32ab9);
    local_1848[0] = local_1838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1848,0x1b32ab9);
    local_1828[0] = local_1818;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1828,0x1b32ab9);
    local_1808[0] = local_17f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1808,0x1b32ab9);
    local_17e8[0] = local_17d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_17e8,0x1b32ab9);
    local_17c8 = 0x2100000002;
    local_17c0 = 0xf;
    local_17bc = 1;
    local_17b8[0] = local_17a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_17b8,0x1b32ab9);
    local_1798[0] = local_1788;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1798,0x1b32ab9);
    local_1778[0] = local_1768;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1778,0x1b32ab9);
    local_1758[0] = local_1748;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1758,0x1b32ab9);
    local_1738[0] = local_1728;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1738,0x1b32ab9);
    local_1718[0] = local_1708;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1718,0x1b32ab9);
    local_16f8 = 0x2200000002;
    local_16f0 = 0x10;
    local_16ec = 0;
    local_16e8[0] = local_16d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_16e8,0x1b32ab9);
    local_16c8[0] = local_16b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_16c8,0x1b32ab9);
    local_16a8[0] = local_1698;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_16a8,0x1b32ab9);
    local_1688[0] = local_1678;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1688,0x1b32ab9);
    local_1668[0] = local_1658;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1668,0x1b32ab9);
    local_1648[0] = local_1638;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1648,0x1b32ab9);
    local_1628 = 0x2200000002;
    local_1620 = 0x10;
    local_161c = 1;
    local_1618[0] = local_1608;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1618,0x1b32ab9);
    local_15f8[0] = local_15e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_15f8,0x1b32ab9);
    local_15d8[0] = local_15c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_15d8,0x1b32ab9);
    local_15b8[0] = local_15a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_15b8,0x1b32ab9);
    local_1598[0] = local_1588;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1598,0x1b32ab9);
    local_1578[0] = local_1568;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1578,0x1b32ab9);
    local_1558 = 0x1100000002;
    local_1550 = 4;
    local_154c = 0;
    local_1548[0] = local_1538;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1548,0x1b32ab9);
    local_1528[0] = local_1518;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1528,0x1b32ab9);
    local_1508[0] = local_14f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,0x1b32ab9);
    local_14e8[0] = local_14d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,0x1b32ab9);
    local_14c8[0] = local_14b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14c8,0x1b32ab9);
    local_14a8[0] = local_1498;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14a8,0x1b32ab9);
    local_1488 = 0x1100000002;
    local_1480 = 4;
    local_147c = 1;
    local_1478[0] = local_1468;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1478,0x1b32ab9);
    local_1458[0] = local_1448;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1458,0x1b32ab9);
    local_1438[0] = local_1428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1438,0x1b32ab9);
    local_1418[0] = local_1408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1418,0x1b32ab9);
    local_13f8[0] = local_13e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_13f8,0x1b32ab9);
    local_13d8[0] = local_13c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_13d8,0x1b32ab9);
    local_13b8 = 0x2300000002;
    local_13b0 = 0xe;
    local_13ac = 0;
    local_13a8[0] = local_1398;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_13a8,0x1b32ab9);
    local_1388[0] = local_1378;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1388,0x1b32ab9);
    local_1368[0] = local_1358;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1368,0x1b32ab9);
    local_1348[0] = local_1338;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1348,0x1b32ab9);
    local_1328[0] = local_1318;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1328,0x1b32ab9);
    local_1308[0] = local_12f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1308,0x1b32ab9);
    local_12e8 = 0x2300000002;
    local_12e0 = 0xe;
    local_12dc = 1;
    local_12d8[0] = local_12c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12d8,0x1b32ab9);
    local_12b8[0] = local_12a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12b8,0x1b32ab9);
    local_1298[0] = local_1288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1298,0x1b32ab9);
    local_1278[0] = local_1268;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1278,0x1b32ab9);
    local_1258[0] = local_1248;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1258,0x1b32ab9);
    local_1238[0] = local_1228;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1238,0x1b32ab9);
    local_1218 = 0x2400000002;
    local_1210 = 0xf;
    local_120c = 0;
    local_1208[0] = local_11f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1208,0x1b32ab9);
    local_11e8[0] = local_11d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_11e8,0x1b32ab9);
    local_11c8[0] = local_11b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_11c8,0x1b32ab9);
    local_11a8[0] = local_1198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_11a8,0x1b32ab9);
    local_1188[0] = local_1178;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1188,0x1b32ab9);
    local_1168[0] = local_1158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1168,0x1b32ab9);
    local_1148 = 0x2400000002;
    local_1140 = 0xf;
    local_113c = 1;
    local_1138[0] = local_1128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1138,0x1b32ab9);
    local_1118[0] = local_1108;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1118,0x1b32ab9);
    local_10f8[0] = local_10e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_10f8,0x1b32ab9);
    local_10d8[0] = local_10c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_10d8,0x1b32ab9);
    local_10b8[0] = local_10a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_10b8,0x1b32ab9);
    local_1098[0] = local_1088;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1098,0x1b32ab9);
    local_1078 = 0x2500000002;
    local_1070 = 0x10;
    local_106c = 0;
    local_1068[0] = local_1058;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1068,0x1b32ab9);
    local_1048[0] = local_1038;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1048,0x1b32ab9);
    local_1028[0] = local_1018;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1028,0x1b32ab9);
    local_1008[0] = local_ff8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1008,0x1b32ab9);
    local_fe8[0] = local_fd8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_fe8,0x1b32ab9);
    local_fc8[0] = local_fb8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_fc8,0x1b32ab9);
    local_fa8 = 0x2500000002;
    local_fa0 = 0x10;
    local_f9c = 1;
    local_f98[0] = local_f88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f98,0x1b32ab9);
    local_f78[0] = local_f68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f78,0x1b32ab9);
    local_f58[0] = local_f48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f58,0x1b32ab9);
    local_f38[0] = local_f28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f38,0x1b32ab9);
    local_f18[0] = local_f08;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f18,0x1b32ab9);
    local_ef8[0] = local_ee8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ef8,0x1b32ab9);
    local_ed8 = 0x1600000002;
    local_ed0 = 5;
    local_ecc = 0;
    local_ec8[0] = local_eb8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ec8,0x1b32ab9);
    local_ea8[0] = local_e98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ea8,0x1b32ab9);
    local_e88[0] = local_e78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e88,0x1b32ab9);
    local_e68[0] = local_e58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e68,0x1b32ab9);
    local_e48[0] = local_e38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e48,0x1b32ab9);
    local_e28[0] = local_e18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e28,0x1b32ab9);
    local_e08 = 0x1600000002;
    local_e00 = 5;
    local_dfc = 1;
    local_df8[0] = local_de8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_df8,0x1b32ab9);
    local_dd8[0] = local_dc8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_dd8,0x1b32ab9);
    local_db8[0] = local_da8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_db8,0x1b32ab9);
    local_d98[0] = local_d88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d98,0x1b32ab9);
    local_d78[0] = local_d68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d78,0x1b32ab9);
    local_d58[0] = local_d48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d58,0x1b32ab9);
    local_d38 = 0x1900000002;
    local_d30 = 8;
    local_d2c = 0;
    local_d28[0] = local_d18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,0x1b32ab9);
    local_d08[0] = local_cf8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d08,0x1b32ab9);
    local_ce8[0] = local_cd8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ce8,0x1b32ab9);
    local_cc8[0] = local_cb8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_cc8,0x1b32ab9);
    local_ca8[0] = local_c98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ca8,0x1b32ab9);
    local_c88[0] = local_c78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c88,0x1b32ab9);
    local_c68 = 0x1900000002;
    local_c60 = 8;
    local_c5c = 1;
    local_c58[0] = local_c48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c58,0x1b32ab9);
    local_c38[0] = local_c28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,0x1b32ab9);
    local_c18[0] = local_c08;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c18,0x1b32ab9);
    local_bf8[0] = local_be8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_bf8,0x1b32ab9);
    local_bd8[0] = local_bc8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_bd8,0x1b32ab9);
    local_bb8[0] = local_ba8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_bb8,0x1b32ab9);
    local_b98 = 0x1c00000002;
    local_b90 = 0xb;
    local_b8c = 0;
    local_b88[0] = local_b78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,0x1b32ab9);
    local_b68[0] = local_b58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b68,0x1b32ab9);
    local_b48[0] = local_b38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b48,0x1b32ab9);
    local_b28[0] = local_b18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,0x1b32ab9);
    local_b08[0] = local_af8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b08,0x1b32ab9);
    local_ae8[0] = local_ad8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,0x1b32ab9);
    local_ac8 = 0x1c00000002;
    local_ac0 = 0xb;
    local_abc = 1;
    local_ab8[0] = local_aa8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ab8,0x1b32ab9);
    local_a98[0] = local_a88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a98,0x1b32ab9);
    local_a78[0] = local_a68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,0x1b32ab9);
    local_a58[0] = local_a48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a58,0x1b32ab9);
    local_a38[0] = local_a28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,0x1b32ab9);
    local_a18[0] = local_a08;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,0x1b32ab9);
    local_9f8 = 0x1700000002;
    local_9f0 = 6;
    local_9ec = 0;
    local_9e8[0] = local_9d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,0x1b32ab9);
    local_9c8[0] = local_9b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9c8,0x1b32ab9);
    local_9a8[0] = local_998;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,0x1b32ab9);
    local_988[0] = local_978;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_988,0x1b32ab9);
    local_968[0] = local_958;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_968,0x1b32ab9);
    local_948[0] = local_938;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_948,0x1b32ab9);
    local_928 = 0x1700000002;
    local_920 = 6;
    local_91c = 1;
    local_918[0] = local_908;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_918,0x1b32ab9);
    local_8f8[0] = local_8e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8f8,0x1b32ab9);
    local_8d8[0] = local_8c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8d8,0x1b32ab9);
    local_8b8[0] = local_8a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8b8,0x1b32ab9);
    local_898[0] = local_888;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_898,0x1b32ab9);
    local_878[0] = local_868;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_878,0x1b32ab9);
    local_858 = 0x1800000002;
    local_850 = 7;
    local_84c = 0;
    local_848[0] = local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,0x1b32ab9);
    local_828[0] = local_818;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_828,0x1b32ab9);
    local_808[0] = local_7f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_808,0x1b32ab9);
    local_7e8[0] = local_7d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,0x1b32ab9);
    local_7c8[0] = local_7b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,0x1b32ab9);
    local_7a8[0] = local_798;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,0x1b32ab9);
    local_788 = 0x1800000002;
    local_780 = 7;
    local_77c = 1;
    local_778[0] = local_768;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_778,0x1b32ab9);
    local_758[0] = local_748;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_758,0x1b32ab9);
    local_738[0] = local_728;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_738,0x1b32ab9);
    local_718[0] = local_708;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_718,0x1b32ab9);
    local_6f8[0] = local_6e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,0x1b32ab9);
    local_6d8[0] = local_6c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,0x1b32ab9);
    local_6b8 = 0x1a00000002;
    local_6b0 = 9;
    local_6ac = 0;
    local_6a8[0] = local_698;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,0x1b32ab9);
    local_688[0] = local_678;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_688,0x1b32ab9);
    local_668[0] = local_658;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_668,0x1b32ab9);
    local_648[0] = local_638;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_648,0x1b32ab9);
    local_628[0] = local_618;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_628,0x1b32ab9);
    local_608[0] = local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,0x1b32ab9);
    local_5e8 = 0x1a00000002;
    local_5e0 = 9;
    local_5dc = 1;
    local_5d8[0] = local_5c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,0x1b32ab9);
    local_5b8[0] = local_5a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,0x1b32ab9);
    local_598[0] = local_588;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_598,0x1b32ab9);
    local_578[0] = local_568;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_578,0x1b32ab9);
    local_558[0] = local_548;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_558,0x1b32ab9);
    local_538[0] = local_528;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_538,0x1b32ab9);
    local_518 = 0x1b00000002;
    local_510 = 10;
    local_50c = 0;
    local_508[0] = local_4f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_508,0x1b32ab9);
    local_4e8[0] = local_4d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,0x1b32ab9);
    local_4c8[0] = local_4b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,0x1b32ab9);
    local_4a8[0] = local_498;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,0x1b32ab9);
    local_488[0] = local_478;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_488,0x1b32ab9);
    local_468[0] = local_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,0x1b32ab9);
    local_448 = 0x1b00000002;
    local_440 = 10;
    local_43c = 1;
    local_438[0] = local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,0x1b32ab9);
    local_418[0] = local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,0x1b32ab9);
    local_3f8[0] = local_3e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,0x1b32ab9);
    local_3d8[0] = local_3c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,0x1b32ab9);
    local_3b8[0] = local_3a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,0x1b32ab9);
    local_398[0] = local_388;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,0x1b32ab9);
    local_378 = 0x1d00000002;
    local_370 = 0xc;
    local_36c = 0;
    local_368[0] = local_358;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_368,0x1b32ab9);
    local_348[0] = local_338;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,0x1b32ab9);
    local_328[0] = local_318;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_328,0x1b32ab9);
    local_308[0] = local_2f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_308,0x1b32ab9);
    local_2e8[0] = local_2d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,0x1b32ab9);
    local_2c8[0] = local_2b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,0x1b32ab9);
    local_2a8 = 0x1d00000002;
    local_2a0 = 0xc;
    local_29c = 1;
    local_298[0] = local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,0x1b32ab9);
    local_278[0] = local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,0x1b32ab9);
    local_258[0] = local_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,0x1b32ab9);
    local_238[0] = local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,0x1b32ab9);
    local_218[0] = local_208;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,0x1b32ab9);
    local_1f8[0] = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,0x1b32ab9);
    local_1d8 = 0x1e00000002;
    local_1d0 = 0xd;
    local_1cc = 0;
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,0x1b32ab9);
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,0x1b32ab9);
    local_188[0] = local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,0x1b32ab9);
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,0x1b32ab9);
    local_148[0] = local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,0x1b32ab9);
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,0x1b32ab9);
    local_108 = 0x1e00000002;
    local_100 = 0xd;
    local_fc = 1;
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,0x1b32ab9);
    local_d8[0] = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,0x1b32ab9);
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,0x1b32ab9);
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,0x1b32ab9);
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,0x1b32ab9);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,0x1b32ab9);
    lVar2 = 0;
    do {
      initIteration(this,(_test_case *)(local_2258 + lVar2));
      bVar1 = executeIteration(this,(_test_case *)(local_2258 + lVar2));
      this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar1);
      lVar2 = lVar2 + 0xd0;
    } while (lVar2 != 0x2220);
    description = "Fail";
    if (this->m_has_test_passed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               this->m_has_test_passed ^ QP_TEST_RESULT_FAIL,description);
    lVar2 = 0x2150;
    do {
      _test_case::~_test_case((_test_case *)(local_2258 + lVar2));
      lVar2 = lVar2 + -0xd0;
    } while (lVar2 != -0xd0);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_2258._0_8_ = local_2258 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2258,"GL_ARB_gpu_shader_fp64 is not supported.","");
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_2258);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test6::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	/* Initialize GL objects needed to run the tests */
	initTest();

	/* Build iteration array to run the tests in an automated manner */
	_test_case test_cases[] = {
		/* Src array size */ /* Src type */ /* Dst type */ /* wrap_dst_type_in_structure */
		{ 2, Utils::VARIABLE_TYPE_INT, Utils::VARIABLE_TYPE_DOUBLE, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_INT, Utils::VARIABLE_TYPE_DOUBLE, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC2, Utils::VARIABLE_TYPE_DVEC2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC2, Utils::VARIABLE_TYPE_DVEC2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC3, Utils::VARIABLE_TYPE_DVEC3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC3, Utils::VARIABLE_TYPE_DVEC3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC4, Utils::VARIABLE_TYPE_DVEC4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC4, Utils::VARIABLE_TYPE_DVEC4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UINT, Utils::VARIABLE_TYPE_DOUBLE, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UINT, Utils::VARIABLE_TYPE_DOUBLE, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC2, Utils::VARIABLE_TYPE_DVEC2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC2, Utils::VARIABLE_TYPE_DVEC2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC3, Utils::VARIABLE_TYPE_DVEC3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC3, Utils::VARIABLE_TYPE_DVEC3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC4, Utils::VARIABLE_TYPE_DVEC4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC4, Utils::VARIABLE_TYPE_DVEC4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_FLOAT, Utils::VARIABLE_TYPE_DOUBLE, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_FLOAT, Utils::VARIABLE_TYPE_DOUBLE, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC2, Utils::VARIABLE_TYPE_DVEC2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC2, Utils::VARIABLE_TYPE_DVEC2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC3, Utils::VARIABLE_TYPE_DVEC3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC3, Utils::VARIABLE_TYPE_DVEC3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC4, Utils::VARIABLE_TYPE_DVEC4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC4, Utils::VARIABLE_TYPE_DVEC4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2, Utils::VARIABLE_TYPE_DMAT2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2, Utils::VARIABLE_TYPE_DMAT2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3, Utils::VARIABLE_TYPE_DMAT3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3, Utils::VARIABLE_TYPE_DMAT3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4, Utils::VARIABLE_TYPE_DMAT4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4, Utils::VARIABLE_TYPE_DMAT4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2X3, Utils::VARIABLE_TYPE_DMAT2X3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2X3, Utils::VARIABLE_TYPE_DMAT2X3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2X4, Utils::VARIABLE_TYPE_DMAT2X4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2X4, Utils::VARIABLE_TYPE_DMAT2X4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3X2, Utils::VARIABLE_TYPE_DMAT3X2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3X2, Utils::VARIABLE_TYPE_DMAT3X2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3X4, Utils::VARIABLE_TYPE_DMAT3X4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3X4, Utils::VARIABLE_TYPE_DMAT3X4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4X2, Utils::VARIABLE_TYPE_DMAT4X2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4X2, Utils::VARIABLE_TYPE_DMAT4X2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4X3, Utils::VARIABLE_TYPE_DMAT4X3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4X3, Utils::VARIABLE_TYPE_DMAT4X3, true, "", "", "", "", "", "" }
	};
	const unsigned int n_test_cases = sizeof(test_cases) / sizeof(test_cases[0]);

	/* Execute all iterations */
	for (unsigned int n_test_case = 0; n_test_case < n_test_cases; ++n_test_case)
	{
		_test_case& test_case = test_cases[n_test_case];

		/* Initialize a program object we will use to perform the casting */
		initIteration(test_case);

		/* Use the program object to XFB the results */
		m_has_test_passed &= executeIteration(test_case);

	} /* for (all test cases) */

	/* We're done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}